

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_187f8::verifyPixelsAreEqual<Imath_3_2::half>
               (DeepImageChannel *c1,DeepImageChannel *c2,int dx,int dy)

{
  long lVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint *puVar10;
  long lVar11;
  long lVar12;
  ArgExc *this;
  ulong uVar13;
  int y;
  int x;
  
  lVar6 = __dynamic_cast(c1,&Imf_3_2::DeepImageChannel::typeinfo,
                         &Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::typeinfo,0);
  if ((lVar6 == 0) ||
     (lVar7 = __dynamic_cast(c2,&Imf_3_2::DeepImageChannel::typeinfo,
                             &Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::typeinfo,0),
     lVar7 == 0)) {
    __cxa_bad_cast();
  }
  lVar5 = *(long *)(c1 + 8);
  lVar8 = Imf_3_2::DeepImageChannel::deepLevel();
  lVar9 = Imf_3_2::DeepImageChannel::deepLevel();
  y = *(int *)(lVar5 + 0x1c);
  do {
    if (*(int *)(lVar5 + 0x24) < y) {
      return;
    }
    for (x = *(int *)(lVar5 + 0x18); x <= *(int *)(lVar5 + 0x20); x = x + 1) {
      puVar10 = Imf_3_2::SampleCountChannel::at((SampleCountChannel *)(lVar8 + 0x58),x,y);
      uVar4 = *puVar10;
      puVar10 = Imf_3_2::SampleCountChannel::at((SampleCountChannel *)(lVar9 + 0x58),x + dx,y + dy);
      if (uVar4 != *puVar10) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different pixel sample counts");
LAB_0010c79b:
        __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      lVar11 = Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)lVar6,x);
      lVar12 = Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)lVar7,x + dx);
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      uVar13 = 0;
      while (uVar4 != uVar13) {
        fVar3 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(lVar11 + uVar13 * 2) * 4)
        ;
        lVar1 = uVar13 * 2;
        uVar13 = uVar13 + 1;
        pfVar2 = (float *)(_imath_half_to_float_table + (ulong)*(ushort *)(lVar12 + lVar1) * 4);
        if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different sample values");
          goto LAB_0010c79b;
        }
      }
    }
    y = y + 1;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual (
    const DeepImageChannel& c1, const DeepImageChannel& c2, int dx, int dy)
{
    const TypedDeepImageChannel<T>& tc1 =
        dynamic_cast<const TypedDeepImageChannel<T>&> (c1);

    const TypedDeepImageChannel<T>& tc2 =
        dynamic_cast<const TypedDeepImageChannel<T>&> (c2);

    const Box2i&              dataWindow = c1.level ().dataWindow ();
    const SampleCountChannel& scc1       = c1.deepLevel ().sampleCounts ();
    const SampleCountChannel& scc2       = c2.deepLevel ().sampleCounts ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n1 = scc1.at (x, y);
            int n2 = scc2.at (x + dx, y + dy);

            if (n1 != n2) throw ArgExc ("different pixel sample counts");

            const T* s1 = tc1.at (x, y);
            const T* s2 = tc2.at (x + dx, y + dy);

            for (int i = 0; i < n1; ++i)
                if (s1[i] != s2[i]) throw ArgExc ("different sample values");
        }
    }
}